

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O0

int ff(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunindextype i;
  sunrealtype w;
  sunrealtype v;
  sunrealtype u;
  sunrealtype *dYdata;
  sunrealtype *Ydata;
  sunrealtype ep;
  sunrealtype b;
  sunrealtype a;
  sunindextype N;
  UserData udata;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  long lVar11;
  void *in_stack_ffffffffffffff88;
  int local_4;
  
  lVar7 = *in_RDX;
  dVar1 = (double)in_RDX[2];
  dVar2 = (double)in_RDX[3];
  dVar3 = (double)in_RDX[5];
  lVar9 = N_VGetArrayPointer(in_RDI);
  iVar8 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                      );
  if (iVar8 == 0) {
    lVar10 = N_VGetArrayPointer(in_RSI);
    iVar8 = check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c);
    if (iVar8 == 0) {
      for (lVar11 = 0; lVar11 < lVar7; lVar11 = lVar11 + 1) {
        dVar4 = *(double *)(lVar9 + lVar11 * 0x18);
        dVar5 = *(double *)(lVar9 + 8 + lVar11 * 0x18);
        dVar6 = *(double *)(lVar9 + 0x10 + lVar11 * 0x18);
        *(double *)(lVar10 + lVar11 * 0x18) = dVar5 * dVar4 * dVar4 + -(dVar6 + 1.0) * dVar4 + dVar1
        ;
        *(double *)(lVar10 + 8 + lVar11 * 0x18) = dVar6 * dVar4 + -(dVar5 * dVar4 * dVar4);
        *(double *)(lVar10 + 0x10 + lVar11 * 0x18) = -dVar6 * dVar4 + (dVar2 - dVar6) / dVar3;
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ff(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata      = (UserData)user_data; /* access problem data    */
  sunindextype N      = udata->N;            /* set variable shortcuts */
  sunrealtype a       = udata->a;
  sunrealtype b       = udata->b;
  sunrealtype ep      = udata->ep;
  sunrealtype* Ydata  = NULL;
  sunrealtype* dYdata = NULL;
  sunrealtype u, v, w;
  sunindextype i;

  /* access data arrays */
  Ydata = N_VGetArrayPointer(y);
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing reactions */
  for (i = 0; i < N; i++)
  {
    /* set shortcuts */
    u = Ydata[IDX(i, 0)];
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* u_t = a - (w+1)*u + v*u^2 */
    dYdata[IDX(i, 0)] = a - (w + ONE) * u + v * u * u;

    /* v_t = w*u - v*u^2 */
    dYdata[IDX(i, 1)] = w * u - v * u * u;

    /* w_t = (b-w)/ep - w*u */
    dYdata[IDX(i, 2)] = (b - w) / ep - w * u;
  }

  /* return success */
  return (0);
}